

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O1

void __thiscall Js::JavascriptRegExpConstructor::EnsureValues(JavascriptRegExpConstructor *this)

{
  char *addr;
  Type *addr_00;
  charcount_t length;
  ScriptContext *scriptContext;
  RegexPattern *pattern;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  charcount_t inputLength;
  char16 *input;
  GroupInfo GVar4;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  uint64 uVar7;
  uint64 uVar8;
  JavascriptString *pJVar9;
  Var nonMatchValue;
  Var pvVar10;
  ulong uVar11;
  Type *addr_01;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  void *pvVar15;
  long lVar16;
  double dVar17;
  
  if (this->reset == true) {
    scriptContext =
         (((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    inputLength = JavascriptString::GetLength((this->lastInput).ptr);
    input = JavascriptString::GetString((this->lastInput).ptr);
    pattern = (this->lastPattern).ptr;
    if (this->invalidatedLastMatch == true) {
      GVar4 = RegexHelper::SimpleMatch(scriptContext,pattern,input,inputLength,0);
      (this->lastMatch).offset = GVar4.offset;
      (this->lastMatch).length = GVar4.length;
      this->invalidatedLastMatch = false;
    }
    if ((this->lastMatch).length == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                  ,0x5d,"(!lastMatch.IsUndefined())","!lastMatch.IsUndefined()");
      if (!bVar2) goto LAB_00d12df9;
      *puVar5 = 0;
    }
    pJVar6 = JavascriptLibrary::GetEmptyString
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    if ((this->lastMatch).length == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/RegexRuntime.h"
                                  ,0x60a,"(length != CharCountFlag)","length != CharCountFlag");
      if (!bVar2) goto LAB_00d12df9;
      *puVar5 = 0;
    }
    uVar14 = (this->lastMatch).offset;
    uVar12 = (this->lastMatch).length + uVar14;
    if ((long)(int)uVar14 < 0) {
      dVar17 = (double)uVar14;
      uVar7 = NumberUtilities::ToSpecial(dVar17);
      bVar2 = NumberUtilities::IsNan(dVar17);
      if (bVar2) {
        uVar8 = NumberUtilities::ToSpecial(dVar17);
        if (uVar8 != 0xfff8000000000000) {
          uVar8 = NumberUtilities::ToSpecial(dVar17);
          if (uVar8 != 0x7ff8000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar2) goto LAB_00d12df9;
            *puVar5 = 0;
          }
        }
      }
      pvVar15 = (void *)(uVar7 ^ 0xfffc000000000000);
    }
    else {
      pvVar15 = (void *)((long)(int)uVar14 | 0x1000000000000);
    }
    Memory::Recycler::WBSetBit((char *)&this->index);
    (this->index).ptr = pvVar15;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->index);
    if ((int)uVar12 < 0) {
      dVar17 = (double)uVar12;
      uVar7 = NumberUtilities::ToSpecial(dVar17);
      bVar2 = NumberUtilities::IsNan(dVar17);
      if (bVar2) {
        uVar8 = NumberUtilities::ToSpecial(dVar17);
        if (uVar8 != 0xfff8000000000000) {
          uVar8 = NumberUtilities::ToSpecial(dVar17);
          if (uVar8 != 0x7ff8000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar2) goto LAB_00d12df9;
            *puVar5 = 0;
          }
        }
      }
      pvVar15 = (void *)(uVar7 ^ 0xfffc000000000000);
    }
    else {
      pvVar15 = (void *)((ulong)uVar12 | 0x1000000000000);
    }
    Memory::Recycler::WBSetBit((char *)&this->lastIndex);
    (this->lastIndex).ptr = pvVar15;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastIndex);
    length = (this->lastMatch).offset;
    pJVar9 = pJVar6;
    if (length != 0) {
      pJVar9 = SubString::New((this->lastInput).ptr,0,length);
    }
    Memory::Recycler::WBSetBit((char *)&this->leftContext);
    (this->leftContext).ptr = pJVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->leftContext);
    pJVar9 = pJVar6;
    if ((uVar12 <= inputLength && inputLength - uVar12 != 0) && uVar12 != 0) {
      pJVar9 = SubString::New((this->lastInput).ptr,uVar12,inputLength - uVar12);
    }
    Memory::Recycler::WBSetBit((char *)&this->rightContext);
    (this->rightContext).ptr = pJVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->rightContext);
    nonMatchValue = RegexHelper::NonMatchValue(scriptContext,true);
    GVar4.offset = (this->lastMatch).offset;
    GVar4.length = (this->lastMatch).length;
    pvVar10 = RegexHelper::GetString(scriptContext,(this->lastInput).ptr,nonMatchValue,GVar4);
    addr_00 = this->captures;
    Memory::Recycler::WBSetBit((char *)addr_00);
    this->captures[0].ptr = pvVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    uVar3 = UnifiedRegex::RegexPattern::NumGroups(pattern);
    uVar14 = (uint)uVar3;
    pJVar9 = pJVar6;
    if (1 < uVar3) {
      bVar2 = UnifiedRegex::RegexPattern::WasLastMatchSuccessful(pattern);
      if (!bVar2) {
        RegexHelper::SimpleMatch(scriptContext,pattern,input,inputLength,(this->lastMatch).offset);
      }
      bVar2 = UnifiedRegex::RegexPattern::WasLastMatchSuccessful(pattern);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                    ,0x72,"(pattern->WasLastMatchSuccessful())",
                                    "pattern->WasLastMatchSuccessful()");
        if (!bVar2) {
LAB_00d12df9:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      uVar12 = 10;
      if (uVar14 < 10) {
        uVar12 = uVar14;
      }
      uVar11 = 2;
      if (2 < uVar12) {
        uVar11 = (ulong)uVar12;
      }
      addr_01 = this->captures;
      uVar13 = 1;
      do {
        addr_01 = addr_01 + 1;
        pvVar10 = RegexHelper::GetGroup
                            (scriptContext,pattern,(this->lastInput).ptr,nonMatchValue,(int)uVar13);
        Memory::Recycler::WBSetBit((char *)addr_01);
        addr_01->ptr = pvVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
      if (uVar3 < 0xb) {
        pJVar9 = (JavascriptString *)this->captures[(ulong)uVar14 - 1].ptr;
      }
      else {
        pJVar9 = (JavascriptString *)
                 RegexHelper::GetGroup
                           (scriptContext,pattern,(this->lastInput).ptr,nonMatchValue,uVar3 - 1);
      }
    }
    Memory::Recycler::WBSetBit((char *)&this->lastParen);
    (this->lastParen).ptr = pJVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastParen);
    if (uVar3 < 10) {
      lVar16 = (ulong)uVar3 << 3;
      do {
        addr = (char *)((long)&addr_00->ptr + lVar16);
        Memory::Recycler::WBSetBit(addr);
        *(JavascriptString **)((long)&addr_00->ptr + lVar16) = pJVar6;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0x50);
    }
    this->reset = false;
  }
  else if (this->invalidatedLastMatch == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x85,"(!invalidatedLastMatch)","!invalidatedLastMatch");
    if (!bVar2) goto LAB_00d12df9;
    *puVar5 = 0;
  }
  return;
}

Assistant:

void JavascriptRegExpConstructor::EnsureValues()
    {
        if (reset)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            const CharCount lastInputLen = lastInput->GetLength();
            const char16* lastInputStr = lastInput->GetString();
            UnifiedRegex::RegexPattern* pattern = lastPattern;

            // When we perform a regex test operation it's possible the result of the operation will be loaded from a cache and the match will not be computed and updated in the ctor.
            // In that case we invalidate the last match stored in the ctor and will need to compute it before it will be accessible via $1 etc.
            // Since we only do this for the case of RegExp.prototype.test cache hit, we know several things:
            //  - The regex is not global or sticky
            //  - There was a match (test returned true)
            if (invalidatedLastMatch)
            {
                this->lastMatch = RegexHelper::SimpleMatch(scriptContext, pattern, lastInputStr, lastInputLen, 0);
                invalidatedLastMatch = false;
            }

            Assert(!lastMatch.IsUndefined());
            JavascriptString* emptyString = scriptContext->GetLibrary()->GetEmptyString();
            CharCount lastIndexVal = lastMatch.EndOffset();
            this->index = JavascriptNumber::ToVar(lastMatch.offset, scriptContext);
            this->lastIndex = JavascriptNumber::ToVar(lastIndexVal, scriptContext);
            this->leftContext = lastMatch.offset > 0 ? SubString::New(lastInput, 0, lastMatch.offset) : emptyString;
            this->rightContext = lastIndexVal > 0 && lastIndexVal < lastInputLen ? SubString::New(lastInput, lastIndexVal, lastInputLen - lastIndexVal) : emptyString;

            Var nonMatchValue = RegexHelper::NonMatchValue(scriptContext, true);
            captures[0] = RegexHelper::GetString(scriptContext, lastInput, nonMatchValue, lastMatch);
            int numGroups = pattern->NumGroups();
            if (numGroups > 1)
            {
                // The RegExp constructor's lastMatch holds the last *successful* match on any regular expression.
                // That regular expression may since have been used for *unsuccessful* matches, in which case
                // its groups will have been reset. Updating the RegExp constructor with the group binding after
                // every match is prohibitively slow. Instead, run the match again using the known last input string.
                if (!pattern->WasLastMatchSuccessful())
                {
                    RegexHelper::SimpleMatch(scriptContext, pattern, lastInputStr, lastInputLen, lastMatch.offset);
                }
                Assert(pattern->WasLastMatchSuccessful());
                for (int groupId = 1; groupId < min(numGroups, NumCtorCaptures); groupId++)
                    captures[groupId] = RegexHelper::GetGroup(scriptContext, pattern, lastInput, nonMatchValue, groupId);

                this->lastParen = numGroups <= NumCtorCaptures ?
                    PointerValue(captures[numGroups - 1]) :
                    RegexHelper::GetGroup(scriptContext, pattern, lastInput, nonMatchValue, numGroups - 1);
            }
            else
            {
                this->lastParen = emptyString;
            }
            for (int groupId = numGroups; groupId < NumCtorCaptures; groupId++)
                captures[groupId] = emptyString;
            reset = false;
        }
        else
        {
            // If we are not resetting the values, the last match cannot be invalidated.
            Assert(!invalidatedLastMatch);
        }
    }